

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::sized_declarations_invalid_sizes1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (sized_declarations_invalid_sizes1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  string *local_388;
  string local_250 [8];
  string shader_source;
  size_t invalid_declarations_index;
  allocator<char> local_220;
  allocator<char> local_21f;
  allocator<char> local_21e;
  allocator<char> local_21d;
  allocator<char> local_21c;
  allocator<char> local_21b;
  allocator<char> local_21a;
  allocator<char> local_219;
  allocator<char> local_218;
  allocator<char> local_217;
  allocator<char> local_216;
  allocator<char> local_215 [20];
  allocator<char> local_201;
  string *local_200;
  string local_1f8 [8];
  string invalid_declarations [15];
  TestShaderType tested_shader_type_local;
  sized_declarations_invalid_sizes1<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  invalid_declarations_index._5_1_ = 1;
  local_200 = local_1f8;
  invalid_declarations[0xe].field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"float x[2][2][2][0];\n",&local_201);
  local_200 = (string *)(invalid_declarations[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations[0].field_2._M_local_buf + 8),"float x[2][2][0][2];\n",
             local_215);
  local_200 = (string *)(invalid_declarations[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations[1].field_2._M_local_buf + 8),"float x[2][0][2][2];\n",
             &local_216);
  local_200 = (string *)(invalid_declarations[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations[2].field_2._M_local_buf + 8),"float x[0][2][2][2];\n",
             &local_217);
  local_200 = (string *)(invalid_declarations[3].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations[3].field_2._M_local_buf + 8),"float x[2][2][0][0];\n",
             &local_218);
  local_200 = (string *)(invalid_declarations[4].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations[4].field_2._M_local_buf + 8),"float x[2][0][2][0];\n",
             &local_219);
  local_200 = (string *)(invalid_declarations[5].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations[5].field_2._M_local_buf + 8),"float x[0][2][2][0];\n",
             &local_21a);
  local_200 = (string *)(invalid_declarations[6].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations[6].field_2._M_local_buf + 8),"float x[2][0][0][2];\n",
             &local_21b);
  local_200 = (string *)(invalid_declarations[7].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations[7].field_2._M_local_buf + 8),"float x[0][2][0][2];\n",
             &local_21c);
  local_200 = (string *)(invalid_declarations[8].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations[8].field_2._M_local_buf + 8),"float x[0][0][2][2];\n",
             &local_21d);
  local_200 = (string *)(invalid_declarations[9].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations[9].field_2._M_local_buf + 8),"float x[2][0][0][0];\n",
             &local_21e);
  local_200 = (string *)(invalid_declarations[10].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations[10].field_2._M_local_buf + 8),"float x[0][2][0][0];\n",
             &local_21f);
  local_200 = (string *)(invalid_declarations[0xb].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations[0xb].field_2._M_local_buf + 8),"float x[0][0][2][0];\n"
             ,&local_220);
  local_200 = (string *)(invalid_declarations[0xc].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations[0xc].field_2._M_local_buf + 8),"float x[0][0][0][2];\n"
             ,(allocator<char> *)((long)&invalid_declarations_index + 7));
  local_200 = (string *)(invalid_declarations[0xd].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations[0xd].field_2._M_local_buf + 8),"float x[0][0][0][0];\n"
             ,(allocator<char> *)((long)&invalid_declarations_index + 6));
  invalid_declarations_index._5_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&invalid_declarations_index + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&invalid_declarations_index + 7));
  std::allocator<char>::~allocator(&local_220);
  std::allocator<char>::~allocator(&local_21f);
  std::allocator<char>::~allocator(&local_21e);
  std::allocator<char>::~allocator(&local_21d);
  std::allocator<char>::~allocator(&local_21c);
  std::allocator<char>::~allocator(&local_21b);
  std::allocator<char>::~allocator(&local_21a);
  std::allocator<char>::~allocator(&local_219);
  std::allocator<char>::~allocator(&local_218);
  std::allocator<char>::~allocator(&local_217);
  std::allocator<char>::~allocator(&local_216);
  std::allocator<char>::~allocator(local_215);
  std::allocator<char>::~allocator(&local_201);
  for (shader_source.field_2._8_8_ = 0; shader_source.field_2._8_8_ == 0;
      shader_source.field_2._8_8_ = shader_source.field_2._8_8_ + 1) {
    std::__cxx11::string::string(local_250);
    std::__cxx11::string::operator=(local_250,(string *)shader_start_abi_cxx11_);
    std::__cxx11::string::operator+=
              (local_250,
               (string *)
               (invalid_declarations[shader_source.field_2._8_8_ + -1].field_2._M_local_buf + 8));
    switch(invalid_declarations[0xe].field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=(local_250,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=(local_250,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=(local_250,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x707);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=(local_250,(string *)shader_end_abi_cxx11_);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[8])(this,(ulong)(uint)invalid_declarations[0xe].field_2._12_4_,local_250);
    std::__cxx11::string::~string(local_250);
  }
  local_388 = (string *)(invalid_declarations[0xe].field_2._M_local_buf + 8);
  do {
    local_388 = local_388 + -0x20;
    std::__cxx11::string::~string(local_388);
  } while (local_388 != local_1f8);
  return;
}

Assistant:

void sized_declarations_invalid_sizes1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string invalid_declarations[] = {
		"float x[2][2][2][0];\n", "float x[2][2][0][2];\n", "float x[2][0][2][2];\n", "float x[0][2][2][2];\n",
		"float x[2][2][0][0];\n", "float x[2][0][2][0];\n", "float x[0][2][2][0];\n", "float x[2][0][0][2];\n",
		"float x[0][2][0][2];\n", "float x[0][0][2][2];\n", "float x[2][0][0][0];\n", "float x[0][2][0][0];\n",
		"float x[0][0][2][0];\n", "float x[0][0][0][2];\n", "float x[0][0][0][0];\n"
	};

	for (size_t invalid_declarations_index = 0;
		 invalid_declarations_index < sizeof(invalid_declarations) / sizeof(invalid_declarations);
		 invalid_declarations_index++)
	{
		std::string shader_source;

		shader_source = shader_start;
		shader_source += invalid_declarations[invalid_declarations_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		this->execute_negative_test(tested_shader_type, shader_source);
	} /* for (int invalid_declarations_index = 0; ...) */
}